

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * pstore::path::win32::join
                   (string *__return_storage_ptr__,string *path,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *paths)

{
  size_t sVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  string *psVar9;
  iterator path_00;
  string result_path;
  string p_drive;
  string result_drive;
  string p_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  char *local_e0;
  size_t local_d8;
  char local_d0;
  undefined7 uStack_cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  char *local_a0;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string *local_38;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  split_drive((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_78,path);
  std::__cxx11::string::operator=((string *)&local_c0,(string *)local_78);
  std::__cxx11::string::operator=((string *)&local_100,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  local_38 = __return_storage_ptr__;
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (paths->_M_len != 0) {
    path_00 = paths->_M_array;
    lVar8 = paths->_M_len << 5;
    local_a0 = "p_drive.length () == 2 && p_drive[1] == \':\'";
    do {
      local_e0 = &local_d0;
      local_98 = &local_88;
      local_d8 = 0;
      local_d0 = '\0';
      local_90 = 0;
      local_88 = '\0';
      split_drive((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78,path_00);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)local_78);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      sVar3 = local_c0._M_string_length;
      sVar1 = local_d8;
      if ((local_90 == 0) || ((*local_98 != '\\' && (*local_98 != '/')))) {
        if ((local_d8 != 0) &&
           ((local_d8 != local_c0._M_string_length ||
            (iVar4 = bcmp(local_e0,local_c0._M_dataplus._M_p,local_d8), iVar4 != 0)))) {
          _Var2._M_p = local_c0._M_dataplus._M_p;
          iVar4 = 0x8c;
          if ((sVar1 != 2) || (local_e0[1] != ':')) {
LAB_00122b5d:
            assert_failed(local_a0,
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/path.cpp"
                          ,iVar4);
          }
          if (sVar3 != 0) {
            iVar4 = 0x8e;
            if ((sVar3 != 2) || (local_c0._M_dataplus._M_p[1] != ':')) {
              local_a0 = 
              "result_drive.length () == 0 || (result_drive.length () == 2 && result_drive[1] == \':\')"
              ;
              goto LAB_00122b5d;
            }
            iVar4 = tolower((int)*local_e0);
            iVar5 = tolower((int)*_Var2._M_p);
            if (iVar4 == iVar5) {
              std::__cxx11::string::_M_assign((string *)&local_c0);
              goto LAB_00122948;
            }
          }
          goto LAB_0012298b;
        }
LAB_00122948:
        if (((local_100._M_string_length != 0) &&
            (local_100._M_dataplus._M_p[local_100._M_string_length - 1] != '/')) &&
           (local_100._M_dataplus._M_p[local_100._M_string_length - 1] != '\\')) {
          std::__cxx11::string::push_back('\0');
        }
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_98);
      }
      else {
        if ((local_d8 != 0) || (local_c0._M_string_length == 0)) {
LAB_0012298b:
          std::__cxx11::string::_M_assign((string *)&local_c0);
        }
        std::__cxx11::string::_M_assign((string *)&local_100);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      path_00 = path_00 + 1;
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != 0);
  }
  psVar9 = local_38;
  if (((local_100._M_string_length == 0) || (*local_100._M_dataplus._M_p == '/')) ||
     ((*local_100._M_dataplus._M_p == '\\' ||
      ((local_c0._M_string_length == 0 ||
       (local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] == ':')))))) {
    std::operator+(local_38,&local_c0,&local_100);
  }
  else {
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
    psVar9 = local_38;
    std::__cxx11::string::_M_replace_aux((ulong)local_78,local_78._8_8_,0,'\x01');
    plVar6 = (long *)std::__cxx11::string::_M_append(local_78,(ulong)local_100._M_dataplus._M_p);
    (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      lVar8 = plVar6[3];
      (psVar9->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&psVar9->field_2 + 8) = lVar8;
    }
    else {
      (psVar9->_M_dataplus)._M_p = (pointer)*plVar6;
      (psVar9->field_2)._M_allocated_capacity = *psVar7;
    }
    psVar9->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return psVar9;
}

Assistant:

std::string join (std::string const & path,
                              std::initializer_list<std::string> const & paths) {
                auto is_path_sep = [] (char const c) { return c == '/' || c == '\\'; };

                std::string result_drive;
                std::string result_path;
                std::tie (result_drive, result_path) = split_drive (path);

                for (auto const & p : paths) {
                    std::string p_drive;
                    std::string p_path;
                    std::tie (p_drive, p_path) = split_drive (p);

                    if (!p_path.empty () && is_path_sep (p_path[0])) {
                        // The second path is absolute
                        if (!p_drive.empty () || result_drive.empty ()) {
                            result_drive = p_drive;
                        }

                        result_path = p_path;
                        continue;
                    }

                    if (!p_drive.empty () && p_drive != result_drive) {
                        PSTORE_ASSERT (p_drive.length () == 2 && p_drive[1] == ':');
                        PSTORE_ASSERT (result_drive.length () == 0 ||
                                       (result_drive.length () == 2 && result_drive[1] == ':'));

                        if (result_drive.length () == 0 ||
                            std::tolower (p_drive[0]) != std::tolower (result_drive[0])) {
                            // Different drives so ignore the first path entirely
                            result_drive = p_drive;
                            result_path = p_path;
                            continue;
                        }

                        // Same drive in different case
                        result_drive = p_drive;
                    }

                    // Second path is relative to the first
                    if (!result_path.empty () && !is_path_sep (result_path.back ())) {
                        result_path += '\\';
                    }
                    result_path += p_path;
                }

                // Add separator between UNC and non-absolute path
                if (!result_path.empty () && !is_path_sep (result_path[0]) &&
                    !result_drive.empty () && result_drive.back () != ':') {

                    return result_drive + '\\' + result_path;
                }

                return result_drive + result_path;
            }